

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linked-list.cpp
# Opt level: O0

void __thiscall LinkedList::control(LinkedList *this)

{
  bool bVar1;
  ostream *poVar2;
  string local_158;
  allocator<char> local_131;
  string local_130 [8];
  string deletionPrompt_1;
  allocator<char> local_e9;
  string local_e8 [8];
  string deletionPrompt;
  allocator<char> local_a1;
  string local_a0 [8];
  string appendPrompt;
  string local_78;
  allocator<char> local_41;
  string local_40 [8];
  string prependPrompt;
  Node *head;
  int stopLoop;
  int linkedListType;
  LinkedList *this_local;
  
  prependPrompt.field_2._8_8_ = 0;
  _stopLoop = this;
  do {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "Enter 1 to prepend, 2 to append, 3 to delete, 4 to insert, and 5 to view list."
                            );
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::istream::operator>>((istream *)&std::cin,(int *)((long)&head + 4));
    if (head._4_4_ == 1) {
      do {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (local_40,"Enter a number to prepend to linked list.",&local_41);
        std::allocator<char>::~allocator(&local_41);
        std::__cxx11::string::string((string *)&local_78,local_40);
        bVar1 = handleActions(this,&local_78,(Node **)((long)&prependPrompt.field_2 + 8),1);
        std::__cxx11::string::~string((string *)&local_78);
        if (bVar1) {
          appendPrompt.field_2._12_4_ = 4;
        }
        else {
          appendPrompt.field_2._12_4_ = 5;
        }
        std::__cxx11::string::~string(local_40);
      } while (appendPrompt.field_2._12_4_ == 4);
    }
    else if (head._4_4_ == 2) {
      do {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (local_a0,"Enter a number to append to linked list.",&local_a1);
        std::allocator<char>::~allocator(&local_a1);
        std::__cxx11::string::string((string *)(deletionPrompt.field_2._M_local_buf + 8),local_a0);
        bVar1 = handleActions(this,(string *)((long)&deletionPrompt.field_2 + 8),
                              (Node **)((long)&prependPrompt.field_2 + 8),2);
        std::__cxx11::string::~string((string *)(deletionPrompt.field_2._M_local_buf + 8));
        if (bVar1) {
          appendPrompt.field_2._12_4_ = 6;
        }
        else {
          appendPrompt.field_2._12_4_ = 7;
        }
        std::__cxx11::string::~string(local_a0);
      } while (appendPrompt.field_2._12_4_ == 6);
    }
    else if (head._4_4_ == 3) {
      do {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (local_e8,"Enter a number to delete from the linked list.",&local_e9);
        std::allocator<char>::~allocator(&local_e9);
        std::__cxx11::string::string((string *)(deletionPrompt_1.field_2._M_local_buf + 8),local_e8)
        ;
        bVar1 = handleActions(this,(string *)((long)&deletionPrompt_1.field_2 + 8),
                              (Node **)((long)&prependPrompt.field_2 + 8),3);
        std::__cxx11::string::~string((string *)(deletionPrompt_1.field_2._M_local_buf + 8));
        if (bVar1) {
          appendPrompt.field_2._12_4_ = 8;
        }
        else {
          appendPrompt.field_2._12_4_ = 9;
        }
        std::__cxx11::string::~string(local_e8);
      } while (appendPrompt.field_2._12_4_ == 8);
    }
    else if (head._4_4_ == 4) {
      do {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (local_130,"Enter a number to insert into the linked list.",&local_131);
        std::allocator<char>::~allocator(&local_131);
        std::__cxx11::string::string((string *)&local_158,local_130);
        bVar1 = handleActions(this,&local_158,(Node **)((long)&prependPrompt.field_2 + 8),4);
        std::__cxx11::string::~string((string *)&local_158);
        if (bVar1) {
          appendPrompt.field_2._12_4_ = 10;
        }
        else {
          appendPrompt.field_2._12_4_ = 0xb;
        }
        std::__cxx11::string::~string(local_130);
      } while (appendPrompt.field_2._12_4_ == 10);
    }
    else if (head._4_4_ == 5) {
      printList(this,(Node *)prependPrompt.field_2._8_8_);
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cout,"Error occurred");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "Enter 0 to continue manipulating the linked list or 1 to exit.");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::istream::operator>>((istream *)&std::cin,(int *)&head);
  } while ((int)head == 0);
  return;
}

Assistant:

void LinkedList::control() {
	int linkedListType, stopLoop;

	// Head node
	Node* head = nullptr;

	while (true) {
		std::cout << "Enter 1 to prepend, 2 to append, 3 to delete, 4 to insert, and 5 to view list." << std::endl;
		std::cin >> linkedListType;

		// Prepend
		if (linkedListType == 1) {
			while (true) {
				std::string prependPrompt = "Enter a number to prepend to linked list.";
				
				if (handleActions(prependPrompt, &head, 1)) {
					continue;
				}
				else {
					break;
				}
			}
		}
		// Append
		else if (linkedListType == 2) {
			while (true) {
				std::string appendPrompt = "Enter a number to append to linked list.";
				
				if (handleActions(appendPrompt, &head, 2)) {
					continue;
				}
				else {
					break;
				}
			}
		}
		// Delete
		else if (linkedListType == 3) {
			while (true) {
				std::string deletionPrompt = "Enter a number to delete from the linked list.";
				
				if (handleActions(deletionPrompt, &head, 3)) {
					continue;
				}
				else {
					break;
				}
			}
		}
		// Insert
		else if (linkedListType == 4) {
			while (true) {
				std::string deletionPrompt = "Enter a number to insert into the linked list.";
				
				if (handleActions(deletionPrompt, &head, 4)) {
					continue;
				}
				else {
					break;
				}
			}
		}
		// View
		else if (linkedListType == 5) {
			printList(head);
		}
		// Exception
		else {
			std::cout << "Error occurred" << std::endl;
		}

		std::cout << "Enter 0 to continue manipulating the linked list or 1 to exit." << std::endl;
		std::cin >> stopLoop;

		if (stopLoop == 0) {
			continue;
		}
		else {
			break;
		}
	}
}